

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status skip_quotes(char **string)

{
  char **string_local;
  
  if (**string == '\"') {
    *string = *string + 1;
    while (**string != '\"') {
      if (**string == '\0') {
        return -1;
      }
      if ((**string == '\\') && (*string = *string + 1, **string == '\0')) {
        return -1;
      }
      *string = *string + 1;
    }
    *string = *string + 1;
    string_local._4_4_ = 0;
  }
  else {
    string_local._4_4_ = -1;
  }
  return string_local._4_4_;
}

Assistant:

static JSON_Status skip_quotes(const char **string) {
    if (**string != '\"') {
        return JSONFailure;
    }
    SKIP_CHAR(string);
    while (**string != '\"') {
        if (**string == '\0') {
            return JSONFailure;
        } else if (**string == '\\') {
            SKIP_CHAR(string);
            if (**string == '\0') {
                return JSONFailure;
            }
        }
        SKIP_CHAR(string);
    }
    SKIP_CHAR(string);
    return JSONSuccess;
}